

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_record_file.c
# Opt level: O1

int main(void)

{
  int iVar1;
  ring_buffer_size_t rVar2;
  PaDeviceInfo *pPVar3;
  char *__s;
  PaStream *stream;
  paTestData data;
  PaStreamParameters outputParameters;
  PaStreamParameters inputParameters;
  PaStream *local_d0;
  undefined8 local_c8;
  void *pvStack_c0;
  PaUtilRingBuffer local_b8;
  FILE *pFStack_80;
  undefined8 local_78;
  PaStreamParameters local_68;
  PaStreamParameters local_48;
  
  local_b8.buffer = (char *)0x0;
  pFStack_80 = (FILE *)0x0;
  local_b8.smallMask = 0;
  local_b8.elementSizeBytes = 0;
  local_b8.readIndex = 0;
  local_b8.bigMask = 0;
  local_b8.bufferSize = 0;
  local_b8.writeIndex = 0;
  local_c8 = 0;
  pvStack_c0 = (void *)0x0;
  local_78 = 0;
  puts("patest_record.c");
  fflush(_stdout);
  pvStack_c0 = PaUtil_AllocateMemory(0x40000);
  if (pvStack_c0 == (void *)0x0) {
    __s = "Could not allocate ring buffer data.";
LAB_00107f5f:
    puts(__s);
  }
  else {
    rVar2 = PaUtil_InitializeRingBuffer(&local_b8,4,0x10000,pvStack_c0);
    if (rVar2 < 0) {
      __s = "Failed to initialize ring buffer. Size is not power of 2 ??";
      goto LAB_00107f5f;
    }
    iVar1 = Pa_Initialize();
    if (iVar1 != 0) goto LAB_00107f66;
    local_48.device = Pa_GetDefaultInputDevice();
    if (local_48.device == -1) {
      main_cold_2();
    }
    else {
      local_48.channelCount = 2;
      local_48.sampleFormat = 1;
      pPVar3 = Pa_GetDeviceInfo(local_48.device);
      local_48.suggestedLatency = pPVar3->defaultLowInputLatency;
      local_48.hostApiSpecificStreamInfo = (void *)0x0;
      iVar1 = Pa_OpenStream(&local_d0,&local_48,(PaStreamParameters *)0x0,44100.0,0x200,1,
                            recordCallback,&local_c8);
      if ((iVar1 != 0) ||
         (pFStack_80 = fopen("audio_data.raw","wb"), iVar1 = 0, pFStack_80 == (FILE *)0x0))
      goto LAB_00107f66;
      while (local_c8._4_4_ != 0) {
        Pa_Sleep(10);
      }
      iVar1 = Pa_StartStream(local_d0);
      if (iVar1 != 0) goto LAB_00107f66;
      iVar1 = 10;
      printf("\n=== Now recording to \'audio_data.raw\' for %d seconds!! Please speak into the microphone. ===\n"
             ,10);
      fflush(_stdout);
      do {
        printf("index = %d\n");
        fflush(_stdout);
        Pa_Sleep(1000);
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
      iVar1 = Pa_CloseStream(local_d0);
      if (iVar1 != 0) goto LAB_00107f66;
      local_c8._4_4_ = 1;
      do {
        Pa_Sleep(10);
      } while (local_c8._4_4_ != 0);
      fclose(pFStack_80);
      pFStack_80 = (FILE *)0x0;
      local_c8 = (ulong)local_c8._4_4_ << 0x20;
      local_68.device = Pa_GetDefaultOutputDevice();
      if (local_68.device == -1) {
        main_cold_1();
      }
      else {
        local_68.channelCount = 2;
        local_68.sampleFormat = 1;
        pPVar3 = Pa_GetDeviceInfo(local_68.device);
        local_68.suggestedLatency = pPVar3->defaultLowOutputLatency;
        local_68.hostApiSpecificStreamInfo = (void *)0x0;
        puts("\n=== Now playing back from file \'audio_data.raw\' until end-of-file is reached ===")
        ;
        fflush(_stdout);
        iVar1 = Pa_OpenStream(&local_d0,(PaStreamParameters *)0x0,&local_68,44100.0,0x200,1,
                              playCallback,&local_c8);
        if ((iVar1 != 0) || (local_d0 == (PaStream *)0x0)) goto LAB_00107f66;
        pFStack_80 = fopen("audio_data.raw","rb");
        if (pFStack_80 != (FILE *)0x0) {
          while (local_c8._4_4_ != 0) {
            Pa_Sleep(10);
          }
          iVar1 = Pa_StartStream(local_d0);
          if (iVar1 != 0) goto LAB_00107f66;
          puts("Waiting for playback to finish.");
          fflush(_stdout);
          iVar1 = Pa_IsStreamActive(local_d0);
          while (iVar1 == 1) {
            printf("index = %d\n",local_c8 & 0xffffffff);
            fflush(_stdout);
            Pa_Sleep(1000);
            iVar1 = Pa_IsStreamActive(local_d0);
          }
          if (iVar1 < 0) goto LAB_00107f66;
        }
        iVar1 = Pa_CloseStream(local_d0);
        if (iVar1 != 0) goto LAB_00107f66;
        fclose(pFStack_80);
        puts("Done.");
        fflush(_stdout);
      }
    }
  }
  iVar1 = 0;
LAB_00107f66:
  Pa_Terminate();
  if (pvStack_c0 != (void *)0x0) {
    PaUtil_FreeMemory(pvStack_c0);
  }
  if (iVar1 != 0) {
    main_cold_3();
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int main(void)
{
    PaStreamParameters  inputParameters,
                        outputParameters;
    PaStream*           stream;
    PaError             err = paNoError;
    paTestData          data = {0};
    unsigned            delayCntr;
    unsigned            numSamples;
    unsigned            numBytes;

    printf("patest_record.c\n"); fflush(stdout);

    /* We set the ring buffer size to about 500 ms */
    numSamples = NextPowerOf2((unsigned)(SAMPLE_RATE * 0.5 * NUM_CHANNELS));
    numBytes = numSamples * sizeof(SAMPLE);
    data.ringBufferData = (SAMPLE *) PaUtil_AllocateMemory( numBytes );
    if( data.ringBufferData == NULL )
    {
        printf("Could not allocate ring buffer data.\n");
        goto done;
    }

    if (PaUtil_InitializeRingBuffer(&data.ringBuffer, sizeof(SAMPLE), numSamples, data.ringBufferData) < 0)
    {
        printf("Failed to initialize ring buffer. Size is not power of 2 ??\n");
        goto done;
    }

    err = Pa_Initialize();
    if( err != paNoError ) goto done;

    inputParameters.device = Pa_GetDefaultInputDevice(); /* default input device */
    if (inputParameters.device == paNoDevice) {
        fprintf(stderr,"Error: No default input device.\n");
        goto done;
    }
    inputParameters.channelCount = 2;                    /* stereo input */
    inputParameters.sampleFormat = PA_SAMPLE_TYPE;
    inputParameters.suggestedLatency = Pa_GetDeviceInfo( inputParameters.device )->defaultLowInputLatency;
    inputParameters.hostApiSpecificStreamInfo = NULL;

    /* Record some audio. -------------------------------------------- */
    err = Pa_OpenStream(
              &stream,
              &inputParameters,
              NULL,                  /* &outputParameters, */
              SAMPLE_RATE,
              FRAMES_PER_BUFFER,
              paClipOff,      /* we won't output out of range samples so don't bother clipping them */
              recordCallback,
              &data );
    if( err != paNoError ) goto done;

    /* Open the raw audio 'cache' file... */
    data.file = fopen(FILE_NAME, "wb");
    if (data.file == 0) goto done;

    /* Start the file writing thread */
    err = startThread(&data, threadFunctionWriteToRawFile);
    if( err != paNoError ) goto done;

    err = Pa_StartStream( stream );
    if( err != paNoError ) goto done;
    printf("\n=== Now recording to '" FILE_NAME "' for %d seconds!! Please speak into the microphone. ===\n", NUM_SECONDS); fflush(stdout);

    /* Note that the RECORDING part is limited with TIME, not size of the file and/or buffer, so you can
       increase NUM_SECONDS until you run out of disk */
    delayCntr = 0;
    while( delayCntr++ < NUM_SECONDS )
    {
        printf("index = %d\n", data.frameIndex ); fflush(stdout);
        Pa_Sleep(1000);
    }
    if( err < 0 ) goto done;

    err = Pa_CloseStream( stream );
    if( err != paNoError ) goto done;

    /* Stop the thread */
    err = stopThread(&data);
    if( err != paNoError ) goto done;

    /* Close file */
    fclose(data.file);
    data.file = 0;

    /* Playback recorded data.  -------------------------------------------- */
    data.frameIndex = 0;

    outputParameters.device = Pa_GetDefaultOutputDevice(); /* default output device */
    if (outputParameters.device == paNoDevice) {
        fprintf(stderr,"Error: No default output device.\n");
        goto done;
    }
    outputParameters.channelCount = 2;                     /* stereo output */
    outputParameters.sampleFormat =  PA_SAMPLE_TYPE;
    outputParameters.suggestedLatency = Pa_GetDeviceInfo( outputParameters.device )->defaultLowOutputLatency;
    outputParameters.hostApiSpecificStreamInfo = NULL;

    printf("\n=== Now playing back from file '" FILE_NAME "' until end-of-file is reached ===\n"); fflush(stdout);
    err = Pa_OpenStream(
              &stream,
              NULL, /* no input */
              &outputParameters,
              SAMPLE_RATE,
              FRAMES_PER_BUFFER,
              paClipOff,      /* we won't output out of range samples so don't bother clipping them */
              playCallback,
              &data );
    if( err != paNoError ) goto done;

    if( stream )
    {
        /* Open file again for reading */
        data.file = fopen(FILE_NAME, "rb");
        if (data.file != 0)
        {
            /* Start the file reading thread */
            err = startThread(&data, threadFunctionReadFromRawFile);
            if( err != paNoError ) goto done;

            err = Pa_StartStream( stream );
            if( err != paNoError ) goto done;

            printf("Waiting for playback to finish.\n"); fflush(stdout);

            /* The playback will end when EOF is reached */
            while( ( err = Pa_IsStreamActive( stream ) ) == 1 ) {
                printf("index = %d\n", data.frameIndex ); fflush(stdout);
                Pa_Sleep(1000);
            }
            if( err < 0 ) goto done;
        }
        
        err = Pa_CloseStream( stream );
        if( err != paNoError ) goto done;

        fclose(data.file);
        
        printf("Done.\n"); fflush(stdout);
    }

done:
    Pa_Terminate();
    if( data.ringBufferData )       /* Sure it is NULL or valid. */
        PaUtil_FreeMemory( data.ringBufferData );
    if( err != paNoError )
    {
        fprintf( stderr, "An error occured while using the portaudio stream\n" );
        fprintf( stderr, "Error number: %d\n", err );
        fprintf( stderr, "Error message: %s\n", Pa_GetErrorText( err ) );
        err = 1;          /* Always return 0 or 1, but no other return codes. */
    }
    return err;
}